

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRELEASEHOOK sq_getreleasehook(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  long lStack_10;
  
  pSVar2 = stack_get(v,idx);
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_CLASS) {
    lStack_10 = 0x1a8;
  }
  else if (SVar1 == OT_USERDATA) {
    lStack_10 = 0x40;
  }
  else {
    if (SVar1 != OT_INSTANCE) {
      return (SQRELEASEHOOK)0x0;
    }
    lStack_10 = 0x48;
  }
  return *(SQRELEASEHOOK *)
          ((long)&(((pSVar2->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._vptr_SQRefCounted + lStack_10);
}

Assistant:

SQRELEASEHOOK sq_getreleasehook(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &ud=stack_get(v,idx);
    switch(sq_type(ud) ) {
    case OT_USERDATA:   return _userdata(ud)->_hook;    break;
    case OT_INSTANCE:   return _instance(ud)->_hook;    break;
    case OT_CLASS:      return _class(ud)->_hook;       break;
    default: return NULL;
    }
}